

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_kx_xx(void)

{
  _Bool _Var1;
  hydro_kx_session_keypair kp_server;
  hydro_kx_session_keypair kp_client;
  uint8_t packet3 [64];
  uint8_t packet2 [96];
  uint8_t packet1 [48];
  uint8_t server_peer_pk [32];
  uint8_t client_peer_pk [32];
  uint8_t psk [32];
  hydro_kx_keypair server_static_kp;
  hydro_kx_keypair client_static_kp;
  hydro_kx_state st_server;
  hydro_kx_state st_client;
  uint8_t *in_stack_fffffffffffffce0;
  uint8_t *in_stack_fffffffffffffce8;
  hydro_kx_state *in_stack_fffffffffffffcf0;
  hydro_kx_keypair *in_stack_fffffffffffffcf8;
  uint8_t *in_stack_fffffffffffffd00;
  uint8_t *in_stack_fffffffffffffd08;
  uint8_t *in_stack_fffffffffffffd10;
  hydro_kx_state *in_stack_fffffffffffffd18;
  hydro_kx_session_keypair *in_stack_fffffffffffffd20;
  hydro_kx_state *in_stack_fffffffffffffd28;
  uint8_t *in_stack_fffffffffffffd30;
  uint8_t *in_stack_fffffffffffffd38;
  hydro_kx_session_keypair *in_stack_fffffffffffffd40;
  hydro_kx_state *in_stack_fffffffffffffd48;
  hydro_kx_keypair *in_stack_fffffffffffffd60;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [64];
  undefined1 local_168 [64];
  undefined1 local_128 [296];
  
  hydro_kx_keygen((hydro_kx_keypair *)0x103104);
  hydro_kx_keygen((hydro_kx_keypair *)0x103111);
  hydro_kx_xx_1(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  hydro_kx_xx_2(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  hydro_kx_xx_3(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                in_stack_fffffffffffffd30,(uint8_t *)in_stack_fffffffffffffd28,
                in_stack_fffffffffffffd20->rx,in_stack_fffffffffffffd60);
  hydro_kx_xx_4(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                (uint8_t *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                in_stack_fffffffffffffd08);
  _Var1 = hydro_equal(&stack0xfffffffffffffd48,&stack0xfffffffffffffce8,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x172,"void test_kx_xx(void)");
  }
  _Var1 = hydro_equal(&stack0xfffffffffffffd28,&stack0xfffffffffffffd08,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x173,"void test_kx_xx(void)");
  }
  hydro_random_buf(in_stack_fffffffffffffcf0,(size_t)in_stack_fffffffffffffce8);
  hydro_kx_xx_1(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  hydro_kx_xx_2(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  hydro_kx_xx_3(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                in_stack_fffffffffffffd30,(uint8_t *)in_stack_fffffffffffffd28,
                in_stack_fffffffffffffd20->rx,in_stack_fffffffffffffd60);
  hydro_kx_xx_4(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                (uint8_t *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                in_stack_fffffffffffffd08);
  _Var1 = hydro_equal(&stack0xfffffffffffffd48,&stack0xfffffffffffffce8,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17b,"void test_kx_xx(void)");
  }
  _Var1 = hydro_equal(&stack0xfffffffffffffd28,&stack0xfffffffffffffd08,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17c,"void test_kx_xx(void)");
  }
  _Var1 = hydro_equal(local_1a8,local_168,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(client_peer_pk, server_static_kp.pk, hydro_kx_PUBLICKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17d,"void test_kx_xx(void)");
  }
  _Var1 = hydro_equal(local_1c8,local_128,0x20);
  if (!_Var1) {
    __assert_fail("hydro_equal(server_peer_pk, client_static_kp.pk, hydro_kx_PUBLICKEYBYTES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x17e,"void test_kx_xx(void)");
  }
  return;
}

Assistant:

static void
test_kx_xx(void)
{
    hydro_kx_state           st_client;
    hydro_kx_state           st_server;
    hydro_kx_keypair         client_static_kp;
    hydro_kx_keypair         server_static_kp;
    uint8_t                  psk[hydro_kx_PSKBYTES];
    uint8_t                  client_peer_pk[hydro_kx_PUBLICKEYBYTES];
    uint8_t                  server_peer_pk[hydro_kx_PUBLICKEYBYTES];
    uint8_t                  packet1[hydro_kx_XX_PACKET1BYTES];
    uint8_t                  packet2[hydro_kx_XX_PACKET2BYTES];
    uint8_t                  packet3[hydro_kx_XX_PACKET3BYTES];
    hydro_kx_session_keypair kp_client;
    hydro_kx_session_keypair kp_server;

    hydro_kx_keygen(&client_static_kp);
    hydro_kx_keygen(&server_static_kp);

    hydro_kx_xx_1(&st_client, packet1, NULL);
    hydro_kx_xx_2(&st_server, packet2, packet1, NULL, &server_static_kp);
    hydro_kx_xx_3(&st_client, &kp_client, packet3, NULL, packet2, NULL, &client_static_kp);
    hydro_kx_xx_4(&st_server, &kp_server, NULL, packet3, NULL);

    assert(hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES));
    assert(hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES));

    hydro_random_buf(psk, sizeof psk);
    hydro_kx_xx_1(&st_client, packet1, psk);
    hydro_kx_xx_2(&st_server, packet2, packet1, psk, &server_static_kp);
    hydro_kx_xx_3(&st_client, &kp_client, packet3, client_peer_pk, packet2, psk, &client_static_kp);
    hydro_kx_xx_4(&st_server, &kp_server, server_peer_pk, packet3, psk);

    assert(hydro_equal(kp_client.tx, kp_server.rx, hydro_kx_SESSIONKEYBYTES));
    assert(hydro_equal(kp_client.rx, kp_server.tx, hydro_kx_SESSIONKEYBYTES));
    assert(hydro_equal(client_peer_pk, server_static_kp.pk, hydro_kx_PUBLICKEYBYTES));
    assert(hydro_equal(server_peer_pk, client_static_kp.pk, hydro_kx_PUBLICKEYBYTES));
}